

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O3

void file_opendir_cb(uv_fs_t *req)

{
  char *__s1;
  int iVar1;
  undefined8 uVar2;
  uv_fs_t *unaff_RBX;
  uv_fs_t *puVar3;
  long lVar4;
  undefined1 auStack_8e0 [440];
  uv_fs_t *puStack_728;
  undefined1 auStack_718 [440];
  uv_fs_t uStack_560;
  undefined1 auStack_3a8 [440];
  undefined1 auStack_1f0 [440];
  
  if (req == &opendir_req) {
    if (opendir_req.fs_type != UV_FS_OPENDIR) goto LAB_0015a9b0;
    if (opendir_req.result != -0x14) goto LAB_0015a9b5;
    if (opendir_req.ptr == (void *)0x0) {
      uv_fs_req_cleanup(&opendir_req);
      file_opendir_cb_count = file_opendir_cb_count + 1;
      return;
    }
  }
  else {
    file_opendir_cb_cold_1();
LAB_0015a9b0:
    file_opendir_cb_cold_2();
LAB_0015a9b5:
    file_opendir_cb_cold_3();
  }
  file_opendir_cb_cold_4();
  puStack_728 = (uv_fs_t *)0x15a9d5;
  cleanup_test_files();
  puStack_728 = (uv_fs_t *)0x15a9da;
  uVar2 = uv_default_loop();
  puStack_728 = (uv_fs_t *)0x15a9f9;
  iVar1 = uv_fs_mkdir(uVar2,auStack_3a8,"test_dir",0x1ed,0);
  if (iVar1 == 0) {
    puStack_728 = (uv_fs_t *)0x15aa06;
    uVar2 = uv_default_loop();
    puStack_728 = (uv_fs_t *)0x15aa2b;
    iVar1 = uv_fs_open(uVar2,&uStack_560,"test_dir/file1",0x41,0x180,0);
    puVar3 = unaff_RBX;
    if (iVar1 < 0) goto LAB_0015add1;
    puVar3 = &uStack_560;
    puStack_728 = (uv_fs_t *)0x15aa43;
    uv_fs_req_cleanup(puVar3);
    puStack_728 = (uv_fs_t *)0x15aa48;
    uVar2 = uv_default_loop();
    puStack_728 = (uv_fs_t *)0x15aa5a;
    iVar1 = uv_fs_close(uVar2,auStack_718,(undefined4)uStack_560.result,0);
    if (iVar1 != 0) goto LAB_0015add6;
    puStack_728 = (uv_fs_t *)0x15aa6c;
    uv_fs_req_cleanup(auStack_718);
    puStack_728 = (uv_fs_t *)0x15aa71;
    uVar2 = uv_default_loop();
    puStack_728 = (uv_fs_t *)0x15aa96;
    iVar1 = uv_fs_open(uVar2,&uStack_560,"test_dir/file2",0x41,0x180,0);
    if (iVar1 < 0) goto LAB_0015addb;
    puVar3 = &uStack_560;
    puStack_728 = (uv_fs_t *)0x15aaae;
    uv_fs_req_cleanup(puVar3);
    puStack_728 = (uv_fs_t *)0x15aab3;
    uVar2 = uv_default_loop();
    puStack_728 = (uv_fs_t *)0x15aac5;
    iVar1 = uv_fs_close(uVar2,auStack_718,(undefined4)uStack_560.result,0);
    if (iVar1 != 0) goto LAB_0015ade0;
    puStack_728 = (uv_fs_t *)0x15aad7;
    uv_fs_req_cleanup(auStack_718);
    puStack_728 = (uv_fs_t *)0x15aadc;
    uVar2 = uv_default_loop();
    puStack_728 = (uv_fs_t *)0x15aafb;
    iVar1 = uv_fs_mkdir(uVar2,auStack_3a8,"test_dir/test_subdir",0x1ed,0);
    if (iVar1 != 0) goto LAB_0015ade5;
    puStack_728 = (uv_fs_t *)0x15ab10;
    uv_fs_req_cleanup(auStack_3a8);
    puVar3 = &opendir_req;
    puStack_728 = (uv_fs_t *)0x15ab29;
    memset(&opendir_req,0xdb,0x1b8);
    puStack_728 = (uv_fs_t *)0x15ab2e;
    uVar2 = uv_default_loop();
    puStack_728 = (uv_fs_t *)0x15ab42;
    iVar1 = uv_fs_opendir(uVar2,&opendir_req,"test_dir",0);
    unaff_RBX = (uv_fs_t *)opendir_req.ptr;
    if (iVar1 != 0) goto LAB_0015adea;
    if (opendir_req.fs_type != UV_FS_OPENDIR) goto LAB_0015adef;
    if (opendir_req.result != 0) goto LAB_0015adf4;
    if (opendir_req.ptr == (void *)0x0) goto LAB_0015adf9;
    *(uv_dirent_t **)opendir_req.ptr = dirents;
    *(undefined8 *)((long)unaff_RBX + 8) = 1;
    puStack_728 = (uv_fs_t *)0x15ab93;
    uv_fs_req_cleanup(&opendir_req);
    puStack_728 = (uv_fs_t *)0x15ab98;
    uVar2 = uv_default_loop();
    puStack_728 = (uv_fs_t *)0x15abac;
    iVar1 = uv_fs_readdir(uVar2,&readdir_req,unaff_RBX,0);
    if (iVar1 == 0) {
LAB_0015adc7:
      puStack_728 = (uv_fs_t *)0x15adcc;
      run_test_fs_readdir_non_empty_dir_cold_21();
      goto LAB_0015adcc;
    }
    lVar4 = 3;
    do {
      __s1 = dirents[0].name;
      puStack_728 = (uv_fs_t *)0x15abe1;
      iVar1 = strcmp(dirents[0].name,"file1");
      if (iVar1 != 0) {
        puStack_728 = (uv_fs_t *)0x15abf4;
        iVar1 = strcmp(__s1,"file2");
        if (iVar1 == 0) goto LAB_0015ac0b;
        puStack_728 = (uv_fs_t *)0x15ac03;
        iVar1 = strcmp(__s1,"test_subdir");
        if (iVar1 == 0) goto LAB_0015ac0b;
LAB_0015adbd:
        puStack_728 = (uv_fs_t *)0x15adc2;
        run_test_fs_readdir_non_empty_dir_cold_10();
LAB_0015adc2:
        puStack_728 = (uv_fs_t *)0x15adc7;
        run_test_fs_readdir_non_empty_dir_cold_12();
        goto LAB_0015adc7;
      }
LAB_0015ac0b:
      puStack_728 = (uv_fs_t *)0x15ac16;
      iVar1 = strcmp(__s1,"test_subdir");
      if (iVar1 == 0) {
        if (dirents[0].type == UV_DIRENT_DIR) goto LAB_0015ac33;
        goto LAB_0015adc2;
      }
      if (dirents[0].type != UV_DIRENT_FILE) {
        puStack_728 = (uv_fs_t *)0x15adbd;
        run_test_fs_readdir_non_empty_dir_cold_11();
        goto LAB_0015adbd;
      }
LAB_0015ac33:
      puStack_728 = (uv_fs_t *)0x15ac3b;
      uv_fs_req_cleanup(&readdir_req);
      puStack_728 = (uv_fs_t *)0x15ac40;
      uVar2 = uv_default_loop();
      puStack_728 = (uv_fs_t *)0x15ac50;
      iVar1 = uv_fs_readdir(uVar2,&readdir_req,unaff_RBX,0);
      lVar4 = lVar4 + -1;
    } while (iVar1 != 0);
    if (lVar4 != 0) goto LAB_0015adc7;
    puStack_728 = (uv_fs_t *)0x15ac70;
    uv_fs_req_cleanup(&readdir_req);
    puStack_728 = (uv_fs_t *)0x15ac89;
    memset(&closedir_req,0xdb,0x1b8);
    puStack_728 = (uv_fs_t *)0x15ac8e;
    uVar2 = uv_default_loop();
    puStack_728 = (uv_fs_t *)0x15ac9e;
    uv_fs_closedir(uVar2,&closedir_req,unaff_RBX,0);
    if (closedir_req.result != 0) goto LAB_0015adfe;
    puStack_728 = (uv_fs_t *)0x15acb8;
    uv_fs_req_cleanup(&closedir_req);
    unaff_RBX = &opendir_req;
    puStack_728 = (uv_fs_t *)0x15acd1;
    memset(&opendir_req,0xdb,0x1b8);
    puStack_728 = (uv_fs_t *)0x15acd6;
    uVar2 = uv_default_loop();
    puStack_728 = (uv_fs_t *)0x15acef;
    iVar1 = uv_fs_opendir(uVar2,&opendir_req,"test_dir",non_empty_opendir_cb);
    if (iVar1 != 0) goto LAB_0015ae03;
    if (non_empty_opendir_cb_count != 0) goto LAB_0015ae08;
    if (non_empty_closedir_cb_count != 0) goto LAB_0015ae0d;
    puStack_728 = (uv_fs_t *)0x15ad16;
    uVar2 = uv_default_loop();
    puStack_728 = (uv_fs_t *)0x15ad20;
    iVar1 = uv_run(uVar2,0);
    if (iVar1 != 0) goto LAB_0015ae12;
    if (non_empty_opendir_cb_count != 1) goto LAB_0015ae17;
    if (non_empty_closedir_cb_count == 1) {
      puStack_728 = (uv_fs_t *)0x15ad47;
      uVar2 = uv_default_loop();
      puStack_728 = (uv_fs_t *)0x15ad63;
      uv_fs_rmdir(uVar2,auStack_1f0,"test_subdir",0);
      puStack_728 = (uv_fs_t *)0x15ad6b;
      uv_fs_req_cleanup(auStack_1f0);
      puStack_728 = (uv_fs_t *)0x15ad70;
      cleanup_test_files();
      puStack_728 = (uv_fs_t *)0x15ad75;
      unaff_RBX = (uv_fs_t *)uv_default_loop();
      puStack_728 = (uv_fs_t *)0x15ad89;
      uv_walk(unaff_RBX,close_walk_cb,0);
      puStack_728 = (uv_fs_t *)0x15ad93;
      uv_run(unaff_RBX,0);
      puStack_728 = (uv_fs_t *)0x15ad98;
      uVar2 = uv_default_loop();
      puStack_728 = (uv_fs_t *)0x15ada0;
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_0015ae21;
    }
  }
  else {
LAB_0015adcc:
    puStack_728 = (uv_fs_t *)0x15add1;
    run_test_fs_readdir_non_empty_dir_cold_1();
    puVar3 = unaff_RBX;
LAB_0015add1:
    puStack_728 = (uv_fs_t *)0x15add6;
    run_test_fs_readdir_non_empty_dir_cold_2();
LAB_0015add6:
    puStack_728 = (uv_fs_t *)0x15addb;
    run_test_fs_readdir_non_empty_dir_cold_3();
LAB_0015addb:
    puStack_728 = (uv_fs_t *)0x15ade0;
    run_test_fs_readdir_non_empty_dir_cold_4();
LAB_0015ade0:
    puStack_728 = (uv_fs_t *)0x15ade5;
    run_test_fs_readdir_non_empty_dir_cold_5();
LAB_0015ade5:
    puStack_728 = (uv_fs_t *)0x15adea;
    run_test_fs_readdir_non_empty_dir_cold_6();
LAB_0015adea:
    puStack_728 = (uv_fs_t *)0x15adef;
    run_test_fs_readdir_non_empty_dir_cold_7();
LAB_0015adef:
    puStack_728 = (uv_fs_t *)0x15adf4;
    run_test_fs_readdir_non_empty_dir_cold_8();
LAB_0015adf4:
    unaff_RBX = puVar3;
    puStack_728 = (uv_fs_t *)0x15adf9;
    run_test_fs_readdir_non_empty_dir_cold_9();
LAB_0015adf9:
    puStack_728 = (uv_fs_t *)0x15adfe;
    run_test_fs_readdir_non_empty_dir_cold_22();
LAB_0015adfe:
    puStack_728 = (uv_fs_t *)0x15ae03;
    run_test_fs_readdir_non_empty_dir_cold_13();
LAB_0015ae03:
    puStack_728 = (uv_fs_t *)0x15ae08;
    run_test_fs_readdir_non_empty_dir_cold_14();
LAB_0015ae08:
    puStack_728 = (uv_fs_t *)0x15ae0d;
    run_test_fs_readdir_non_empty_dir_cold_15();
LAB_0015ae0d:
    puStack_728 = (uv_fs_t *)0x15ae12;
    run_test_fs_readdir_non_empty_dir_cold_16();
LAB_0015ae12:
    puStack_728 = (uv_fs_t *)0x15ae17;
    run_test_fs_readdir_non_empty_dir_cold_17();
LAB_0015ae17:
    puStack_728 = (uv_fs_t *)0x15ae1c;
    run_test_fs_readdir_non_empty_dir_cold_18();
  }
  puStack_728 = (uv_fs_t *)0x15ae21;
  run_test_fs_readdir_non_empty_dir_cold_19();
LAB_0015ae21:
  puStack_728 = (uv_fs_t *)cleanup_test_files;
  run_test_fs_readdir_non_empty_dir_cold_20();
  puStack_728 = unaff_RBX;
  uv_fs_unlink(0,auStack_8e0,"test_dir/file1",0);
  uv_fs_req_cleanup(auStack_8e0);
  uv_fs_unlink(0,auStack_8e0,"test_dir/file2",0);
  uv_fs_req_cleanup(auStack_8e0);
  uv_fs_rmdir(0,auStack_8e0,"test_dir/test_subdir",0);
  uv_fs_req_cleanup(auStack_8e0);
  uv_fs_rmdir(0,auStack_8e0,"test_dir",0);
  uv_fs_req_cleanup(auStack_8e0);
  return;
}

Assistant:

static void file_opendir_cb(uv_fs_t* req) {
  ASSERT(req == &opendir_req);
  ASSERT(req->fs_type == UV_FS_OPENDIR);
  ASSERT(req->result == UV_ENOTDIR);
  ASSERT(req->ptr == NULL);

  uv_fs_req_cleanup(req);
  ++file_opendir_cb_count;
}